

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall
r_code::list<core::P<r_exec::_GMonitor>_>::push_front
          (list<core::P<r_exec::_GMonitor>_> *this,P<r_exec::_GMonitor> *t)

{
  long lVar1;
  pointer pcVar2;
  long lVar3;
  
  if (this->free_cell_count == 0) {
    push_front_new_cell(this,t);
  }
  else {
    lVar1 = this->free_cells;
    pcVar2 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_GMonitor>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_GMonitor>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar1;
    this->free_cells = pcVar2->next;
    this->free_cell_count = this->free_cell_count - 1;
    core::P<r_exec::_GMonitor>::operator=(&pcVar2->data,t);
    pcVar2 = (this->cells).
             super__Vector_base<r_code::list<core::P<r_exec::_GMonitor>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_GMonitor>_>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2[lVar1].next = this->used_cells_head;
    pcVar2[lVar1].prev = -1;
    this->used_cells_head = lVar1;
  }
  pcVar2 = (this->cells).
           super__Vector_base<r_code::list<core::P<r_exec::_GMonitor>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_GMonitor>_>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = this->used_cells_head;
  lVar3 = pcVar2[lVar1].next;
  if (lVar3 != -1) {
    pcVar2[lVar3].prev = lVar1;
  }
  if (this->used_cells_tail == -1) {
    this->used_cells_tail = lVar1;
  }
  this->used_cell_count = this->used_cell_count + 1;
  return;
}

Assistant:

void push_front(const T &t)
    {
        if (free_cell_count) {
            push_front_free_cell(t);
        } else {
            push_front_new_cell(t);
        }

        update_used_cells_head_state();
    }